

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O2

QSize operator*(QSize *s,qreal c)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = c * (double)(*s).wd.m_i;
  dVar7 = c * (double)(*s).ht.m_i;
  dVar6 = (double)((ulong)dVar6 & 0x8000000000000000 | 0x3fe0000000000000) + dVar6;
  dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  auVar1._4_4_ = -(uint)(-2147483648.0 < dVar6);
  auVar1._0_4_ = -(uint)(-2147483648.0 < dVar7);
  auVar1._8_4_ = -(uint)(2147483647.0 < dVar7);
  auVar1._12_4_ = -(uint)(2147483647.0 < dVar6);
  uVar2 = movmskps(in_EAX,auVar1);
  uVar5 = 0x80000000;
  if ((uVar2 & 2) != 0) {
    uVar5 = (ulong)(uint)(int)dVar6;
  }
  uVar3 = 0x8000000000000000;
  if ((uVar2 & 1) != 0) {
    uVar3 = (ulong)(uint)(int)dVar7 << 0x20;
  }
  uVar4 = 0x7fffffff00000000;
  if ((uVar2 & 4) == 0) {
    uVar4 = uVar3;
  }
  uVar3 = 0x7fffffff;
  if ((uVar2 & 8) == 0) {
    uVar3 = uVar5;
  }
  return (QSize)(uVar3 | uVar4);
}

Assistant:

friend inline constexpr QSize operator*(const QSize &s, qreal c) noexcept
    { return QSize(QtPrivate::qSaturateRound(s.width() * c), QtPrivate::qSaturateRound(s.height() * c)); }